

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

void __thiscall duckdb_re2::SparseArray<int>::~SparseArray(SparseArray<int> *this)

{
  SparseArray<int> *in_RDI;
  
  DebugCheckInvariants(in_RDI);
  PODArray<duckdb_re2::SparseArray<int>::IndexValue>::~PODArray
            ((PODArray<duckdb_re2::SparseArray<int>::IndexValue> *)0x80b936);
  PODArray<int>::~PODArray((PODArray<int> *)0x80b944);
  return;
}

Assistant:

SparseArray<Value>::~SparseArray() {
  DebugCheckInvariants();
}